

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O0

void TTD::NSSnapValues::ExtractSnapPrimitiveValue
               (SnapPrimitiveValue *snapValue,RecyclableObject *jsValue,bool isWellKnown,
               TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*> *idToTypeMap,
               SlabAllocator *alloc)

{
  BOOL BVar1;
  charcount_t length;
  PropertyId PVar2;
  RecyclableObject **ppRVar3;
  Type *pTVar4;
  SnapType **ppSVar5;
  ScriptContext *pSVar6;
  _func_int **pp_Var7;
  JavascriptLibrary *this;
  JavascriptBoolean *this_00;
  JavascriptTypedNumber<long> *this_01;
  JavascriptTypedNumber<unsigned_long> *this_02;
  JavascriptString *pJVar8;
  char16 *str;
  char16 *local_50;
  JavascriptLibrary *jslib;
  TTD_WELLKNOWN_TOKEN lookupToken;
  Type *objType;
  SlabAllocator *alloc_local;
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*> *idToTypeMap_local;
  RecyclableObject *pRStack_18;
  bool isWellKnown_local;
  RecyclableObject *jsValue_local;
  SnapPrimitiveValue *snapValue_local;
  
  pRStack_18 = jsValue;
  jsValue_local = (RecyclableObject *)snapValue;
  ppRVar3 = Memory::PointerValue<Js::RecyclableObject>(&stack0xffffffffffffffe8);
  (jsValue_local->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
       = (_func_int **)*ppRVar3;
  pTVar4 = Js::RecyclableObject::GetType(pRStack_18);
  ppSVar5 = TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*>::LookupKnownItem
                      (idToTypeMap,(unsigned_long)pTVar4);
  (jsValue_local->type).ptr = (Type *)*ppSVar5;
  if (isWellKnown) {
    pSVar6 = Js::RecyclableObject::GetScriptContext(pRStack_18);
    local_50 = RuntimeContextInfo::ResolvePathForKnownObject(pSVar6->TTDWellKnownInfo,pRStack_18);
  }
  else {
    local_50 = (char16 *)0x0;
  }
  pp_Var7 = (_func_int **)SlabAllocatorBase<0>::CopyRawNullTerminatedStringInto(alloc,local_50);
  jsValue_local[1].super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
       = pp_Var7;
  if (jsValue_local[1].super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject == (_func_int **)0x0) {
    this = Js::RecyclableObject::GetLibrary(pRStack_18);
    switch(*(undefined4 *)&(((jsValue_local->type).ptr)->javascriptLibrary).ptr) {
    case 0:
    case 1:
      break;
    case 2:
      this_00 = Js::VarTo<Js::JavascriptBoolean,Js::RecyclableObject>(pRStack_18);
      BVar1 = Js::JavascriptBoolean::GetValue(this_00);
      *(BOOL *)&jsValue_local[1].type.ptr = BVar1;
      break;
    default:
      TTDAbort_unrecoverable_error
                (
                "These are supposed to be primitive values on the heap e.g., no pointers or properties."
                );
    case 4:
      pTVar4 = (Type *)Js::JavascriptNumber::GetValue(pRStack_18);
      jsValue_local[1].type.ptr = pTVar4;
      break;
    case 5:
      this_01 = Js::VarTo<Js::JavascriptTypedNumber<long>,Js::RecyclableObject>(pRStack_18);
      pTVar4 = (Type *)Js::JavascriptTypedNumber<long>::GetValue(this_01);
      jsValue_local[1].type.ptr = pTVar4;
      break;
    case 6:
      this_02 = Js::VarTo<Js::JavascriptTypedNumber<unsigned_long>,Js::RecyclableObject>(pRStack_18)
      ;
      pTVar4 = (Type *)Js::JavascriptTypedNumber<unsigned_long>::GetValue(this_02);
      jsValue_local[1].type.ptr = pTVar4;
      break;
    case 7:
      pTVar4 = (Type *)SlabAllocatorBase<0>::SlabAllocateStruct<TTD::TTString>(alloc);
      jsValue_local[1].type.ptr = pTVar4;
      pJVar8 = Js::VarTo<Js::JavascriptString,Js::RecyclableObject>(pRStack_18);
      str = Js::JavascriptString::GetString(pJVar8);
      pJVar8 = Js::VarTo<Js::JavascriptString,Js::RecyclableObject>(pRStack_18);
      length = Js::JavascriptString::GetLength(pJVar8);
      SlabAllocatorBase<0>::CopyStringIntoWLength
                (alloc,str,length,(TTString *)jsValue_local[1].type.ptr);
      break;
    case 8:
      PVar2 = Js::JavascriptLibrary::ExtractPrimitveSymbolId_TTD(this,pRStack_18);
      *(PropertyId *)&jsValue_local[1].type.ptr = PVar2;
    }
  }
  return;
}

Assistant:

void ExtractSnapPrimitiveValue(SnapPrimitiveValue* snapValue, Js::RecyclableObject* jsValue, bool isWellKnown, const TTDIdentifierDictionary<TTD_PTR_ID, NSSnapType::SnapType*>& idToTypeMap, SlabAllocator& alloc)
        {
            snapValue->PrimitiveValueId = TTD_CONVERT_VAR_TO_PTR_ID(jsValue);

            Js::Type* objType = jsValue->GetType();
            snapValue->SnapType = idToTypeMap.LookupKnownItem(TTD_CONVERT_TYPEINFO_TO_PTR_ID(objType));

            TTD_WELLKNOWN_TOKEN lookupToken = isWellKnown ? jsValue->GetScriptContext()->TTDWellKnownInfo->ResolvePathForKnownObject(jsValue) : TTD_INVALID_WELLKNOWN_TOKEN;
            snapValue->OptWellKnownToken = alloc.CopyRawNullTerminatedStringInto(lookupToken);

            if(snapValue->OptWellKnownToken == TTD_INVALID_WELLKNOWN_TOKEN)
            {
                Js::JavascriptLibrary* jslib = jsValue->GetLibrary();

                switch(snapValue->SnapType->JsTypeId)
                {
                case Js::TypeIds_Undefined:
                case Js::TypeIds_Null:
                    break;
                case Js::TypeIds_Boolean:
                    snapValue->u_boolValue = Js::VarTo<Js::JavascriptBoolean>(jsValue)->GetValue();
                    break;
                case Js::TypeIds_Number:
                    snapValue->u_doubleValue = Js::JavascriptNumber::GetValue(jsValue);
                    break;
                case Js::TypeIds_Int64Number:
                    snapValue->u_int64Value = Js::VarTo<Js::JavascriptInt64Number>(jsValue)->GetValue();
                    break;
                case Js::TypeIds_UInt64Number:
                    snapValue->u_uint64Value = Js::VarTo<Js::JavascriptUInt64Number>(jsValue)->GetValue();
                    break;
                case Js::TypeIds_String:
                    snapValue->u_stringValue = alloc.SlabAllocateStruct<TTString>();
                    alloc.CopyStringIntoWLength(Js::VarTo<Js::JavascriptString>(jsValue)->GetString(), Js::VarTo<Js::JavascriptString>(jsValue)->GetLength(), *(snapValue->u_stringValue));
                    break;
                case Js::TypeIds_Symbol:
                    snapValue->u_propertyIdValue = jslib->ExtractPrimitveSymbolId_TTD(jsValue);
                    break;
                default:
                    TTDAssert(false, "These are supposed to be primitive values on the heap e.g., no pointers or properties.");
                    break;
                }
            }
        }